

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O2

void __thiscall ForStatement::print(ForStatement *this)

{
  ostream *poVar1;
  
  std::operator<<((ostream *)&std::cout,"for ");
  (**this->_id->_vptr_ExprNode)();
  std::operator<<((ostream *)&std::cout," in range(");
  Testlist::print(this->_testlist);
  poVar1 = std::operator<<((ostream *)&std::cout,") :");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"     ");
  Statements::print(this->_stmts);
  std::operator<<((ostream *)&std::cout,"");
  return;
}

Assistant:

void ForStatement::print() {

    std::cout << "for ";
    _id->print();
    std::cout << " in range(";
    _testlist->print();
    std::cout << ") :" << std::endl;
    std::cout << "     ";
    _stmts->print();
    std::cout << "";

}